

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int mbedtls_asn1_get_len(uchar **p,uchar *end,size_t *len)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar6;
  
  pbVar4 = *p;
  if ((long)end - (long)pbVar4 < 1) {
    return -0x60;
  }
  if (-1 < (char)*pbVar4) {
    *p = pbVar4 + 1;
    *len = (ulong)*pbVar4;
    goto LAB_002165bc;
  }
  uVar5 = *pbVar4 & 0x7f;
  uVar6 = (ulong)uVar5;
  cVar1 = (char)uVar5;
  if ((byte)(cVar1 - 5U) < 0xfc) {
    pbVar4 = (byte *)0xffffff9c;
LAB_002165b4:
    bVar2 = false;
  }
  else {
    if ((long)end - (long)pbVar4 <= (long)uVar6) {
      pbVar4 = (byte *)0xffffffa0;
      goto LAB_002165b4;
    }
    *len = 0;
    *p = pbVar4 + 1;
    bVar2 = true;
    if (cVar1 != '\0') {
      pbVar4 = pbVar4 + 2;
      uVar7 = 0;
      do {
        uVar7 = uVar7 << 8 | (ulong)pbVar4[-1];
        *len = uVar7;
        *p = pbVar4;
        pbVar4 = pbVar4 + 1;
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != 0);
    }
  }
  if (!bVar2) {
    return (int)pbVar4;
  }
LAB_002165bc:
  iVar3 = -0x60;
  if (*len <= (ulong)((long)end - (long)*p)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_asn1_get_len(unsigned char **p,
                         const unsigned char *end,
                         size_t *len)
{
    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    if ((**p & 0x80) == 0) {
        *len = *(*p)++;
    } else {
        int n = (**p) & 0x7F;
        if (n == 0 || n > 4) {
            return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
        }
        if ((end - *p) <= n) {
            return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
        }
        *len = 0;
        (*p)++;
        while (n--) {
            *len = (*len << 8) | **p;
            (*p)++;
        }
    }

    if (*len > (size_t) (end - *p)) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return 0;
}